

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_rem_x86_64(float64 a,float64 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  float64 fVar5;
  float64 b_00;
  uint64_t uVar6;
  uint64_t zSig;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  fVar5 = float64_squash_input_denormal_x86_64(a,status);
  b_00 = float64_squash_input_denormal_x86_64(b,status);
  uVar11 = fVar5 & 0xfffffffffffff;
  uVar7 = (uint)(fVar5 >> 0x34) & 0x7ff;
  uVar12 = b_00 & 0xfffffffffffff;
  uVar14 = (uint)(b_00 >> 0x34) & 0x7ff;
  if (uVar7 == 0x7ff) {
    if ((uVar11 == 0) && (uVar12 == 0 || uVar14 != 0x7ff)) {
LAB_004a850c:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar5 = float64_default_nan_x86_64((float_status *)b);
      return fVar5;
    }
LAB_004a83f7:
    fVar5 = propagateFloat64NaN(fVar5,b_00,status);
    return fVar5;
  }
  if (uVar14 == 0) {
    if (uVar12 == 0) goto LAB_004a850c;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar14 = ((uint)lVar10 ^ 0x3f) + 0xf5;
    uVar12 = uVar12 << ((byte)uVar14 & 0x3f);
    uVar14 = 1 - (uVar14 & 0xff);
  }
  else if (uVar14 == 0x7ff) {
    if (uVar12 == 0) {
      return fVar5;
    }
    goto LAB_004a83f7;
  }
  if (uVar7 == 0) {
    if (uVar11 == 0) {
      return fVar5;
    }
    lVar10 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar7 = ((uint)lVar10 ^ 0x3f) + 0xf5;
    uVar11 = uVar11 << ((byte)uVar7 & 0x3f);
    uVar7 = 1 - (uVar7 & 0xff);
  }
  uVar11 = uVar11 << 0xb | 0x8000000000000000;
  iVar8 = uVar7 - uVar14;
  if (iVar8 < 0) {
    if (iVar8 != -1) {
      return fVar5;
    }
    uVar11 = uVar11 >> 1;
  }
  uVar13 = uVar12 << 0xb | 0x8000000000000000;
  uVar9 = (ulong)(uVar13 <= uVar11);
  uVar12 = 0;
  if (uVar13 <= uVar11) {
    uVar12 = uVar13;
  }
  uVar11 = uVar11 - uVar12;
  uVar12 = uVar13 >> 2;
  for (iVar8 = iVar8 + -0x40; 0 < iVar8; iVar8 = iVar8 + -0x3e) {
    uVar6 = estimateDiv128To64(uVar11,0,uVar13);
    uVar9 = uVar6 - 2;
    if (uVar6 < 2) {
      uVar9 = 0;
    }
    uVar11 = -(uVar12 * uVar9);
  }
  if (iVar8 < -0x3f) {
    uVar11 = uVar11 >> 2;
  }
  else {
    uVar6 = estimateDiv128To64(uVar11,0,uVar13);
    uVar9 = uVar6 - 2;
    if (uVar6 < 2) {
      uVar9 = 0;
    }
    uVar9 = uVar9 >> (-(char)iVar8 & 0x3fU);
    uVar11 = ((uVar11 >> 1) << ((char)iVar8 + 0x3fU & 0x3f)) - uVar9 * uVar12;
  }
  uVar13 = 0xffffffffffffffff;
  if ((long)(uVar11 - uVar12) < -1) {
    uVar13 = uVar11 - uVar12;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar12;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ~uVar13 + uVar11;
  uVar13 = SUB168(auVar2 / auVar1,0);
  zSig = uVar11 - uVar12 * uVar13;
  uVar6 = ~uVar13 * uVar12 + uVar11;
  lVar10 = uVar6 + zSig;
  if ((lVar10 < 0) || (bVar3 = 1, lVar10 == 0 && ((int)uVar9 + SUB164(auVar2 / auVar1,0) & 1U) == 0)
     ) {
    bVar3 = (byte)(zSig >> 0x38);
    bVar4 = bVar3 >> 7;
    uVar6 = zSig;
    bVar3 = bVar3 >> 7;
    if (-1 < (long)zSig) goto LAB_004a858b;
  }
  bVar4 = bVar3;
  zSig = -uVar6;
LAB_004a858b:
  fVar5 = normalizeRoundAndPackFloat64(bVar4 ^ (byte)(fVar5 >> 0x3f),uVar14,zSig,status);
  return fVar5;
}

Assistant:

float64 float64_rem(float64 a, float64 b, float_status *status)
{
    flag aSign, zSign;
    int aExp, bExp, expDiff;
    uint64_t aSig, bSig;
    uint64_t q, alternateASig;
    int64_t sigMean;

    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    bSig = extractFloat64Frac( b );
    bExp = extractFloat64Exp( b );
    if ( aExp == 0x7FF ) {
        if ( aSig || ( ( bExp == 0x7FF ) && bSig ) ) {
            return propagateFloat64NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    if ( bExp == 0x7FF ) {
        if (bSig) {
            return propagateFloat64NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            float_raise(float_flag_invalid, status);
            return float64_default_nan(status);
        }
        normalizeFloat64Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return a;
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    expDiff = aExp - bExp;
    aSig = (aSig | UINT64_C(0x0010000000000000)) << 11;
    bSig = (bSig | UINT64_C(0x0010000000000000)) << 11;
    if ( expDiff < 0 ) {
        if ( expDiff < -1 ) return a;
        aSig >>= 1;
    }
    q = ( bSig <= aSig );
    if ( q ) aSig -= bSig;
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
#ifdef _MSC_VER
        aSig = 0ULL - ( ( bSig>>2 ) * q );
#else
        aSig = - ( ( bSig>>2 ) * q );
#endif
        expDiff -= 62;
    }
    expDiff += 64;
    if ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig, 0, bSig );
        q = ( 2 < q ) ? q - 2 : 0;
        q >>= 64 - expDiff;
        bSig >>= 2;
        aSig = ( ( aSig>>1 )<<( expDiff - 1 ) ) - bSig * q;
    }
    else {
        aSig >>= 2;
        bSig >>= 2;
    }
    do {
        alternateASig = aSig;
        ++q;
        aSig -= bSig;
    } while ( 0 <= (int64_t) aSig );
    sigMean = aSig + alternateASig;
    if ( ( sigMean < 0 ) || ( ( sigMean == 0 ) && ( q & 1 ) ) ) {
        aSig = alternateASig;
    }
    zSign = ( (int64_t) aSig < 0 );
#ifdef _MSC_VER
    if ( zSign ) aSig = 0 - aSig;
#else
    if ( zSign ) aSig = - aSig;
#endif
    return normalizeRoundAndPackFloat64(aSign ^ zSign, bExp, aSig, status);

}